

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::
ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
::removeLast(ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
             *this)

{
  RemoveConst<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
  *pRVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 node;
  ClientHook *pCVar2;
  Disposer *pDVar3;
  
  pRVar1 = this->pos;
  this->pos = pRVar1 + -1;
  if (pRVar1[-1].value.vineInfo.ptr.ptr != (VineInfo *)0x0) {
    pRVar1[-1].value.vineInfo.ptr.ptr = (VineInfo *)0x0;
    (**(pRVar1[-1].value.vineInfo.ptr.disposer)->_vptr_Disposer)();
  }
  if ((pRVar1[-1].value.resolveOp.ptr.isSet == true) &&
     (node = pRVar1[-1].value.resolveOp.ptr.field_1,
     node != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
    pRVar1[-1].value.resolveOp.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  pCVar2 = pRVar1[-1].value.clientHook.ptr;
  if (pCVar2 != (ClientHook *)0x0) {
    pRVar1[-1].value.clientHook.ptr = (ClientHook *)0x0;
    pDVar3 = pRVar1[-1].value.clientHook.disposer;
    (**pDVar3->_vptr_Disposer)
              (pDVar3,(_func_int *)
                      ((long)&pCVar2->_vptr_ClientHook + (long)pCVar2->_vptr_ClientHook[-2]));
    return;
  }
  return;
}

Assistant:

void removeLast() {
    KJ_IREQUIRE(pos > ptr, "No elements present to remove.");
    kj::dtor(*--pos);
  }